

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O1

Stats * __thiscall
SpecificStrategy::extractStats(Stats *__return_storage_ptr__,SpecificStrategy *this,Info *info)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Call call;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  __return_storage_ptr__->_vptr_Stats = (_func_int **)&PTR__Stats_00117cf8;
  __return_storage_ptr__->instrs = 0;
  (__return_storage_ptr__->blocks).perfect = 0;
  *(undefined8 *)&(__return_storage_ptr__->blocks).conflict = 0;
  (__return_storage_ptr__->edges).internal.perfect = 0;
  (__return_storage_ptr__->edges).internal.conflict = 0;
  (__return_storage_ptr__->edges).external.perfect = 0;
  (__return_storage_ptr__->edges).external.conflict = 0;
  __return_storage_ptr__->calls = 0;
  __return_storage_ptr__->indirects = 0;
  __return_storage_ptr__->instrs =
       (int)(info->instrs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->blocks).perfect =
       (int)(info->blocks).perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->blocks).conflict =
       (int)(info->blocks).conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->phantoms =
       __return_storage_ptr__->phantoms +
       (int)(info->phantoms)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).internal.perfect =
       (int)(info->edges).internal.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).internal.conflict =
       (int)(info->edges).internal.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).external.perfect =
       (int)(info->edges).external.perfect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->edges).external.conflict =
       (int)(info->edges).external.conflict._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __return_storage_ptr__->calls = 0;
  p_Var2 = (info->calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(info->calls)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_60,
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&p_Var2[1]._M_left);
      __return_storage_ptr__->calls =
           __return_storage_ptr__->calls + (int)local_60._M_impl.super__Rb_tree_header._M_node_count
      ;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_60);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  __return_storage_ptr__->indirects =
       __return_storage_ptr__->indirects +
       (int)(info->indirects)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Stats SpecificStrategy::extractStats(const SpecificStrategy::Info& info) {
	Stats s;

	s.instrs = info.instrs.size();

	s.blocks.perfect = info.blocks.perfect.size();
	s.blocks.conflict = info.blocks.conflict.size();

	s.phantoms += info.phantoms.size();

	s.edges.internal.perfect = info.edges.internal.perfect.size();
	s.edges.internal.conflict = info.edges.internal.conflict.size();
	s.edges.external.perfect = info.edges.external.perfect.size();
	s.edges.external.conflict = info.edges.external.conflict.size();

	s.calls = 0;
	for (CfgData::Call call : info.calls)
		s.calls += call.calls.size();

	s.indirects += info.indirects.size();

	return s;
}